

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

int Mpm_CutAlloc(Mpm_Man_t *p,int nLeaves,Mpm_Cut_t **ppCut)

{
  undefined1 *puVar1;
  size_t __size;
  byte bVar2;
  undefined4 uVar3;
  Mmr_Step_t *pMVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  void *__s;
  Mpm_Cut_t *pMVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  pMVar4 = p->pManCuts;
  uVar12 = nLeaves * 4 + 0xcU >> 3;
  if (pMVar4->uMask < (int)uVar12) {
    __assert_fail("nWords > 0 && nWords <= p->uMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                  ,0xf3,"int Mmr_StepFetch(Mmr_Step_t *, int)");
  }
  iVar6 = pMVar4->nEntries + 1;
  pMVar4->nEntries = iVar6;
  pMVar4->nEntriesAll = pMVar4->nEntriesAll + 1;
  if (iVar6 < pMVar4->nEntriesMax) {
    iVar6 = pMVar4->nEntriesMax;
  }
  pMVar4->nEntriesMax = iVar6;
  lVar8 = (ulong)uVar12 * 0x38;
  iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x44);
  if (iVar6 == 0) {
    iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x34);
    bVar2 = *(byte *)((long)pMVar4 + lVar8 + 0x18);
    __size = (long)*(int *)((long)pMVar4 + lVar8 + 0x1c) * 8 + 8;
    __s = malloc(__size);
    memset(__s,0xff,__size);
    Vec_PtrPush((Vec_Ptr_t *)((long)pMVar4 + lVar8 + 0x30),__s);
    iVar10 = *(int *)((long)pMVar4 + lVar8 + 0x20);
    for (uVar13 = 1; (int)(iVar10 + uVar13) <= *(int *)((long)pMVar4 + lVar8 + 0x1c);
        uVar13 = uVar13 + iVar10) {
      Vec_IntPush((Vec_Int_t *)((long)pMVar4 + lVar8 + 0x40),uVar13 | iVar6 << (bVar2 & 0x1f));
      iVar10 = *(int *)((long)pMVar4 + lVar8 + 0x20);
    }
    iVar10 = -1;
    for (lVar11 = 0; iVar6 = *(int *)((long)pMVar4 + lVar8 + 0x44), lVar11 < iVar6 / 2;
        lVar11 = lVar11 + 1) {
      lVar5 = *(long *)((long)pMVar4 + lVar8 + 0x48);
      uVar3 = *(undefined4 *)(lVar5 + lVar11 * 4);
      *(undefined4 *)(lVar5 + lVar11 * 4) = *(undefined4 *)(lVar5 + (long)(iVar6 + iVar10) * 4);
      *(undefined4 *)(lVar5 + (long)(*(int *)((long)pMVar4 + lVar8 + 0x44) + iVar10) * 4) = uVar3;
      iVar10 = iVar10 + -1;
    }
  }
  iVar10 = *(int *)((long)pMVar4 + lVar8 + 0x28);
  iVar7 = *(int *)((long)pMVar4 + lVar8 + 0x24) + 1;
  *(int *)((long)pMVar4 + lVar8 + 0x24) = iVar7;
  if (iVar7 < iVar10) {
    iVar7 = iVar10;
  }
  *(int *)((long)pMVar4 + lVar8 + 0x28) = iVar7;
  if (iVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  *(uint *)((long)pMVar4 + lVar8 + 0x44) = iVar6 - 1U;
  uVar12 = *(int *)(*(long *)((long)pMVar4 + lVar8 + 0x48) + (ulong)(iVar6 - 1U) * 4) <<
           ((byte)pMVar4->nBits & 0x1f) | uVar12;
  pMVar9 = (Mpm_Cut_t *)Mmr_StepEntry(p->pManCuts,uVar12);
  *ppCut = pMVar9;
  *(uint *)&pMVar9->field_0x4 = *(uint *)&pMVar9->field_0x4 & 0x7ffffff | nLeaves << 0x1b;
  pMVar9 = *ppCut;
  pMVar9->hNext = 0;
  puVar1 = &pMVar9->field_0x7;
  *puVar1 = *puVar1 & 0xfb;
  *(uint *)&(*ppCut)->field_0x4 = *(uint *)&(*ppCut)->field_0x4 & 0xfdffffff;
  return uVar12;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//#define MIG_RUNTIME

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cut manipulation.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline int Mpm_CutAlloc( Mpm_Man_t * p, int nLeaves, Mpm_Cut_t ** ppCut )  
{ 
    int hHandle = Mmr_StepFetch( p->pManCuts, Mpm_CutWordNum(nLeaves) );
    *ppCut      = (Mpm_Cut_t *)Mmr_StepEntry( p->pManCuts, hHandle );
    (*ppCut)->nLeaves  = nLeaves;
    (*ppCut)->hNext    = 0;
    (*ppCut)->fUseless = 0;
    (*ppCut)->fCompl   = 0;
    return hHandle;
}